

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleStrategy.cpp
# Opt level: O0

ostream * operator<<(ostream *os,Stats *stats)

{
  ostream *poVar1;
  Stats *stats_local;
  ostream *os_local;
  
  poVar1 = std::operator<<(os,"cfgs(");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,stats->cfgs);
  poVar1 = std::operator<<(poVar1,"), ");
  poVar1 = std::operator<<(poVar1,"instrs(");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,stats->instrs);
  poVar1 = std::operator<<(poVar1,"), ");
  poVar1 = std::operator<<(poVar1,"blocks(");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,stats->blocks);
  poVar1 = std::operator<<(poVar1,"), ");
  poVar1 = std::operator<<(poVar1,"phantoms(");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,stats->phantoms);
  poVar1 = std::operator<<(poVar1,"), ");
  poVar1 = std::operator<<(poVar1,"edges(");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,stats->edges);
  poVar1 = std::operator<<(poVar1,"), ");
  poVar1 = std::operator<<(poVar1,"calls(");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,stats->calls);
  std::operator<<(poVar1,")");
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const SimpleStrategy::Stats& stats) {
	os << "cfgs(" << stats.cfgs << "), "
		<< "instrs(" << stats.instrs << "), "
		<< "blocks(" << stats.blocks << "), "
		<< "phantoms(" << stats.phantoms << "), "
		<< "edges(" << stats.edges << "), "
		<< "calls(" << stats.calls << ")";
	return os;
}